

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O0

CURLcode trc_opt(char *config)

{
  int iVar1;
  undefined1 local_40 [8];
  Curl_str dns;
  char *token;
  undefined1 auStack_20 [4];
  int lvl;
  Curl_str out;
  char *config_local;
  
  out.len = (size_t)config;
  do {
    iVar1 = Curl_str_until((char **)&out.len,(Curl_str *)auStack_20,0x20,',');
    if (iVar1 != 0) {
      return CURLE_OK;
    }
    token._4_4_ = 1;
    dns.len = (size_t)_auStack_20;
    if (*_auStack_20 == '-') {
      token._4_4_ = 0;
      Curl_str_nudge((Curl_str *)auStack_20,1);
    }
    else if (*_auStack_20 == '+') {
      Curl_str_nudge((Curl_str *)auStack_20,1);
    }
    iVar1 = Curl_str_casecompare((Curl_str *)auStack_20,"all");
    if (iVar1 == 0) {
      iVar1 = Curl_str_casecompare((Curl_str *)auStack_20,"protocol");
      if (iVar1 == 0) {
        iVar1 = Curl_str_casecompare((Curl_str *)auStack_20,"network");
        if (iVar1 == 0) {
          iVar1 = Curl_str_casecompare((Curl_str *)auStack_20,"proxy");
          if (iVar1 == 0) {
            iVar1 = Curl_str_casecompare((Curl_str *)auStack_20,"doh");
            if (iVar1 == 0) {
              trc_apply_level_by_name((Curl_str *)auStack_20,token._4_4_);
            }
            else {
              local_40 = (undefined1  [8])0x1c30c8;
              dns.str = (char *)0x3;
              trc_apply_level_by_name((Curl_str *)local_40,token._4_4_);
            }
          }
          else {
            trc_apply_level_by_category(4,token._4_4_);
          }
        }
        else {
          trc_apply_level_by_category(2,token._4_4_);
        }
      }
      else {
        trc_apply_level_by_category(1,token._4_4_);
      }
    }
    else {
      trc_apply_level_by_category(0,token._4_4_);
    }
    iVar1 = Curl_str_single((char **)&out.len,',');
  } while (iVar1 == 0);
  return CURLE_OK;
}

Assistant:

static CURLcode trc_opt(const char *config)
{
  struct Curl_str out;
  while(!Curl_str_until(&config, &out, 32, ',')) {
    int lvl = CURL_LOG_LVL_INFO;
    const char *token = Curl_str(&out);

    if(*token == '-') {
      lvl = CURL_LOG_LVL_NONE;
      Curl_str_nudge(&out, 1);
    }
    else if(*token == '+')
      Curl_str_nudge(&out, 1);

    if(Curl_str_casecompare(&out, "all"))
      trc_apply_level_by_category(TRC_CT_NONE, lvl);
    else if(Curl_str_casecompare(&out, "protocol"))
      trc_apply_level_by_category(TRC_CT_PROTOCOL, lvl);
    else if(Curl_str_casecompare(&out, "network"))
      trc_apply_level_by_category(TRC_CT_NETWORK, lvl);
    else if(Curl_str_casecompare(&out, "proxy"))
      trc_apply_level_by_category(TRC_CT_PROXY, lvl);
    else if(Curl_str_casecompare(&out, "doh")) {
      struct Curl_str dns = { "dns", 3 };
      trc_apply_level_by_name(&dns, lvl);
    }
    else
      trc_apply_level_by_name(&out, lvl);

    if(Curl_str_single(&config, ','))
      break;
  }
  return CURLE_OK;
}